

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O1

void __thiscall
wasm::ReReloop::addSwitchBranch
          (ReReloop *this,Block *from,Block *to,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *values)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> list;
  _Rb_tree_color local_34 [2];
  uint i;
  
  auStack_58 = (undefined1  [8])0x0;
  list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(values->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_34[0] = p_Var1[1]._M_color;
      if (list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_58,
                   (iterator)
                   list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,local_34);
      }
      else {
        *list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = local_34[0];
        list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  CFG::Block::AddSwitchBranchTo
            (from,to,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
             (Expression *)0x0);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return;
}

Assistant:

void addSwitchBranch(CFG::Block* from,
                       CFG::Block* to,
                       const std::set<Index>& values) {
    std::vector<Index> list;
    for (auto i : values) {
      list.push_back(i);
    }
    from->AddSwitchBranchTo(to, std::move(list));
  }